

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pystring.cpp
# Opt level: O1

void pystring::split(string *str,
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *result,string *sep,int maxsplit)

{
  ulong uVar1;
  char cVar2;
  char cVar3;
  ulong uVar4;
  pointer pcVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  int local_9c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string *local_60;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(result,(result->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start);
  local_9c = 0x7fffffff;
  if ((uint)maxsplit < 0x7fffffff) {
    local_9c = maxsplit;
  }
  uVar9 = sep->_M_string_length;
  uVar4 = str->_M_string_length;
  local_58 = str;
  if (uVar9 == 0) {
    if (uVar4 == 0) {
      uVar9 = 0;
    }
    else {
      uVar7 = 0;
      do {
        pcVar5 = (str->_M_dataplus)._M_p;
        uVar8 = uVar7 + 1;
        if (uVar7 + 1 < uVar4) {
          uVar8 = uVar4;
        }
        do {
          iVar6 = ::isspace((int)pcVar5[uVar7]);
          str = local_58;
          uVar9 = uVar7;
          if (iVar6 == 0) break;
          uVar7 = uVar7 + 1;
          uVar9 = uVar8;
        } while (uVar8 != uVar7);
        uVar8 = uVar9;
        uVar7 = uVar9;
        if (uVar9 < uVar4) {
          do {
            iVar6 = ::isspace((int)pcVar5[uVar7]);
            uVar8 = uVar7;
            if (iVar6 != 0) break;
            uVar7 = uVar7 + 1;
            uVar8 = uVar4;
          } while (uVar4 != uVar7);
        }
        uVar7 = uVar8;
        if (uVar9 < uVar8) {
          if (local_9c < 1) break;
          std::__cxx11::string::substr((ulong)&local_80,(ulong)str);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)result,
                     &local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
          local_9c = local_9c + -1;
          uVar9 = uVar8;
          if (uVar8 < uVar4) {
            pcVar5 = (str->_M_dataplus)._M_p;
            do {
              iVar6 = ::isspace((int)pcVar5[uVar8]);
              uVar9 = uVar8;
              uVar7 = uVar8;
              if (iVar6 == 0) break;
              uVar8 = uVar8 + 1;
              uVar9 = uVar4;
              uVar7 = uVar4;
            } while (uVar4 != uVar8);
          }
        }
      } while (uVar7 < uVar4);
    }
    if (uVar4 <= uVar9) {
      return;
    }
    std::__cxx11::string::substr((ulong)&local_80,(ulong)str);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)result,&local_80
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == &local_80.field_2) {
      return;
    }
  }
  else {
    if (uVar9 <= uVar4) {
      uVar7 = 0;
      uVar8 = uVar9;
      local_60 = sep;
      do {
        cVar2 = (str->_M_dataplus)._M_p[uVar7];
        cVar3 = *(sep->_M_dataplus)._M_p;
        if (cVar2 == cVar3) {
          std::__cxx11::string::substr((ulong)&local_80,(ulong)str);
          if (local_80._M_string_length == sep->_M_string_length) {
            if (local_80._M_string_length == 0) {
              bVar10 = true;
            }
            else {
              iVar6 = bcmp(local_80._M_dataplus._M_p,(sep->_M_dataplus)._M_p,
                           local_80._M_string_length);
              bVar10 = iVar6 == 0;
            }
          }
          else {
            bVar10 = false;
          }
        }
        else {
          bVar10 = false;
        }
        str = local_58;
        if ((cVar2 == cVar3) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2)) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        sep = local_60;
        if (bVar10) {
          if (local_9c < 1) break;
          std::__cxx11::string::substr((ulong)&local_50,(ulong)str);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)result,
                     &local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          local_9c = local_9c + -1;
        }
        else {
          uVar8 = uVar7 + 1;
        }
        uVar1 = uVar8 + uVar9;
        uVar7 = uVar8;
        uVar8 = uVar1;
      } while (uVar1 <= uVar4);
    }
    std::__cxx11::string::substr((ulong)&local_50,(ulong)str);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)result,&local_50
              );
    local_80.field_2._M_allocated_capacity = local_50.field_2._M_allocated_capacity;
    local_80._M_dataplus._M_p = local_50._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return;
    }
  }
  operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void split( const std::string & str, std::vector< std::string > & result, const std::string & sep, int maxsplit )
    {
        result.clear();

        if ( maxsplit < 0 ) maxsplit = MAX_32BIT_INT;//result.max_size();


        if ( sep.size() == 0 )
        {
            split_whitespace( str, result, maxsplit );
            return;
        }

        std::string::size_type i,j, len = str.size(), n = sep.size();

        i = j = 0;

        while ( i+n <= len )
        {
            if ( str[i] == sep[0] && str.substr( i, n ) == sep )
            {
                if ( maxsplit-- <= 0 ) break;

                result.push_back( str.substr( j, i - j ) );
                i = j = i + n;
            }
            else
            {
                i++;
            }
        }

        result.push_back( str.substr( j, len-j ) );
    }